

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O1

int SplittingStepGetNumEvolves(void *arkode_mem,int partition,long *evolves)

{
  uint uVar1;
  long *plVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ARKodeSplittingStepMem step_mem;
  ARKodeMem ark_mem;
  
  ark_mem = (ARKodeMem)0x0;
  step_mem = (ARKodeSplittingStepMem)0x0;
  iVar3 = splittingStep_AccessARKODEStepMem
                    (arkode_mem,"SplittingStepGetNumEvolves",&ark_mem,&step_mem);
  if (iVar3 == 0) {
    uVar1 = step_mem->partitions;
    if (partition < (int)uVar1) {
      if (partition < 0) {
        *evolves = 0;
        if (0 < (int)uVar1) {
          plVar2 = step_mem->n_stepper_evolves;
          lVar4 = *evolves;
          uVar5 = 0;
          do {
            lVar4 = lVar4 + plVar2[uVar5];
            *evolves = lVar4;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
          return 0;
        }
      }
      else {
        *evolves = step_mem->n_stepper_evolves[(uint)partition];
      }
      iVar3 = 0;
    }
    else {
      iVar3 = -0x16;
      arkProcessError(ark_mem,-0x16,0x2e4,"SplittingStepGetNumEvolves",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                      ,"The partition index is %i but there are only %i partitions",
                      (ulong)(uint)partition,(ulong)uVar1);
    }
  }
  return iVar3;
}

Assistant:

int SplittingStepGetNumEvolves(void* arkode_mem, int partition, long int* evolves)
{
  ARKodeMem ark_mem               = NULL;
  ARKodeSplittingStepMem step_mem = NULL;
  int retval = splittingStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                                 &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (partition >= step_mem->partitions)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "The partition index is %i but there are only %i partitions",
                    partition, step_mem->partitions);
    return ARK_ILL_INPUT;
  }

  if (partition < 0)
  {
    *evolves = 0;
    for (int k = 0; k < step_mem->partitions; k++)
    {
      *evolves += step_mem->n_stepper_evolves[k];
    }
  }
  else { *evolves = step_mem->n_stepper_evolves[partition]; }

  return ARK_SUCCESS;
}